

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall
CTcHashEntryPpDefine::CTcHashEntryPpDefine
          (CTcHashEntryPpDefine *this,textchar_t *str,size_t len,int copy,int has_args,int argc,
          int has_varargs,char **argv,size_t *argvlen,char *expansion,size_t expan_len)

{
  void *pvVar1;
  undefined8 *puVar2;
  CVmHashTable *this_00;
  CVmHashEntry *entry_00;
  char *pcVar3;
  undefined8 *in_RDI;
  byte in_R8B;
  int in_R9D;
  byte in_stack_00000008;
  undefined8 in_stack_00000028;
  CTcHashEntryPpArg *entry;
  int i;
  size_t *in_stack_000000f8;
  CTcHashEntryPpDefine *in_stack_00000100;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  CVmHashFunc *in_stack_ffffffffffffff90;
  CVmHashEntry *in_stack_ffffffffffffff98;
  CTcHashEntryPp *in_stack_ffffffffffffffa0;
  int local_28;
  
  CTcHashEntryPp::CTcHashEntryPp
            (in_stack_ffffffffffffffa0,(textchar_t *)in_stack_ffffffffffffff98,
             (size_t)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  *in_RDI = &PTR__CTcHashEntryPpDefine_0043f240;
  *(byte *)((long)in_RDI + 0x44) = *(byte *)((long)in_RDI + 0x44) & 0xfe | in_R8B & 1;
  *(byte *)((long)in_RDI + 0x44) =
       *(byte *)((long)in_RDI + 0x44) & 0xfd | (in_stack_00000008 & 1) << 1;
  *(int *)(in_RDI + 8) = in_R9D;
  if (in_R9D == 0) {
    in_RDI[5] = 0;
    in_RDI[7] = 0;
    in_RDI[6] = 0;
  }
  else {
    pvVar1 = malloc((long)in_R9D << 3);
    in_RDI[5] = pvVar1;
    pvVar1 = operator_new(0x20);
    puVar2 = (undefined8 *)operator_new(8);
    *puVar2 = 0;
    CVmHashFuncCS::CVmHashFuncCS((CVmHashFuncCS *)in_stack_ffffffffffffff90);
    CVmHashTable::CVmHashTable
              ((CVmHashTable *)in_stack_ffffffffffffffa0,
               (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff8c);
    in_RDI[7] = pvVar1;
    pvVar1 = malloc((long)in_R9D << 3);
    in_RDI[6] = pvVar1;
    for (local_28 = 0; local_28 < in_R9D; local_28 = local_28 + 1) {
      this_00 = (CVmHashTable *)
                lib_copy_str((char *)in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90);
      *(CVmHashTable **)(in_RDI[5] + (long)local_28 * 8) = this_00;
      entry_00 = (CVmHashEntry *)operator_new(0x28);
      CTcHashEntryPpArg::CTcHashEntryPpArg
                ((CTcHashEntryPpArg *)this_00,(char *)entry_00,(size_t)in_stack_ffffffffffffff90,
                 in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
      in_stack_ffffffffffffff98 = entry_00;
      CVmHashTable::add(this_00,entry_00);
      *(CVmHashEntry **)(in_RDI[6] + (long)local_28 * 8) = entry_00;
    }
  }
  pcVar3 = lib_copy_str((char *)in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90);
  in_RDI[0xb] = pcVar3;
  in_RDI[0xc] = in_stack_00000028;
  parse_expansion(in_stack_00000100,in_stack_000000f8);
  return;
}

Assistant:

CTcHashEntryPpDefine::CTcHashEntryPpDefine(const textchar_t *str, size_t len,
                                           int copy, int has_args, int argc,
                                           int has_varargs,
                                           const char **argv,
                                           const size_t *argvlen,
                                           const char *expansion,
                                           size_t expan_len)
    : CTcHashEntryPp(str, len, copy)
{
    /* copy the argument list if necessary */
    has_args_ = has_args;
    has_varargs_ = has_varargs;
    argc_ = argc;
    if (argc != 0)
    {
        int i;
        
        /* allocate the argument list */
        argv_ = (char **)t3malloc(argc * sizeof(*argv_));

        /* allocate the parameters hash table */
        params_table_ = new CVmHashTable(16, new CVmHashFuncCS(), TRUE);

        /* allocate the entry list */
        arg_entry_ = (CTcHashEntryPpArg **)
                     t3malloc(argc * sizeof(arg_entry_[0]));

        /* copy the arguments */
        for (i = 0 ; i < argc ; ++i)
        {
            CTcHashEntryPpArg *entry;
            
            /* copy the argument name */
            argv_[i] = lib_copy_str(argv[i], argvlen[i]);

            /* 
             *   Create the hash entries for this parameters.  We'll use
             *   this entry to look up tokens in the expansion text for
             *   matches to the formal names when expanding the macro.
             *   
             *   Note that we'll refer directly to our local copy of the
             *   argument name, so we don't need to make another copy in
             *   the hash entry.  
             */
            entry = new CTcHashEntryPpArg(argv_[i], argvlen[i], FALSE, i);
            params_table_->add(entry);

            /* add it to our by-index list */
            arg_entry_[i] = entry;
        }
    }
    else
    {
        /* no arguments */
        argv_ = 0;
        params_table_ = 0;
        arg_entry_ = 0;
    }

    /* save the original version of the expansion */
    orig_expan_ = lib_copy_str(expansion, expan_len);
    orig_expan_len_ = expan_len;

    /* parse the expansion, and save the parsed result */
    parse_expansion(argvlen);
}